

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool iter_new_container_partial_init(roaring_uint32_iterator_t *newit)

{
  container_t *pcVar1;
  long *in_RDI;
  _Bool local_1;
  
  *(undefined4 *)(in_RDI + 4) = 0;
  if ((*(int *)((long)in_RDI + 0x14) < *(int *)*in_RDI) && (-1 < *(int *)((long)in_RDI + 0x14))) {
    *(undefined1 *)((long)in_RDI + 0x24) = 1;
    in_RDI[1] = *(long *)(*(long *)(*in_RDI + 8) + (long)*(int *)((long)in_RDI + 0x14) * 8);
    *(undefined1 *)(in_RDI + 2) =
         *(undefined1 *)(*(long *)(*in_RDI + 0x18) + (long)*(int *)((long)in_RDI + 0x14));
    *(uint *)(in_RDI + 3) =
         (uint)*(ushort *)(*(long *)(*in_RDI + 0x10) + (long)*(int *)((long)in_RDI + 0x14) * 2) <<
         0x10;
    pcVar1 = container_unwrap_shared((container_t *)in_RDI[1],(uint8_t *)(in_RDI + 2));
    in_RDI[1] = (long)pcVar1;
    local_1 = true;
  }
  else {
    *(undefined4 *)(in_RDI + 4) = 0xffffffff;
    *(undefined1 *)((long)in_RDI + 0x24) = 0;
    local_1 = false;
  }
  return local_1;
}

Assistant:

CROARING_WARN_UNUSED static bool iter_new_container_partial_init(
    roaring_uint32_iterator_t *newit) {
    newit->current_value = 0;
    if (newit->container_index >= newit->parent->high_low_container.size ||
        newit->container_index < 0) {
        newit->current_value = UINT32_MAX;
        return (newit->has_value = false);
    }
    newit->has_value = true;
    // we precompute container, typecode and highbits so that successive
    // iterators do not have to grab them from odd memory locations
    // and have to worry about the (easily predicted) container_unwrap_shared
    // call.
    newit->container =
        newit->parent->high_low_container.containers[newit->container_index];
    newit->typecode =
        newit->parent->high_low_container.typecodes[newit->container_index];
    newit->highbits =
        ((uint32_t)
             newit->parent->high_low_container.keys[newit->container_index])
        << 16;
    newit->container =
        container_unwrap_shared(newit->container, &(newit->typecode));
    return true;
}